

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_code(char *file,int row,int col,char *message,...)

{
  FILE *file_00;
  CharBuff *pCVar1;
  char in_AL;
  char *pcVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  CharBuff *local_40;
  CharBuff *buff;
  va_list args;
  char *message_local;
  int col_local;
  int row_local;
  char *file_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  buff._4_4_ = 0x30;
  buff._0_4_ = 0x20;
  local_d8 = in_R8;
  local_d0 = in_R9;
  args[0].reg_save_area = message;
  local_40 = new_buff(100);
  append_str(local_40,file);
  append_str(local_40,":");
  pCVar1 = local_40;
  pcVar2 = itochr(row);
  append_str(pCVar1,pcVar2);
  append_chr(local_40,':');
  pCVar1 = local_40;
  pcVar2 = itochr(col);
  append_str(pCVar1,pcVar2);
  append_chr(local_40,':');
  append_str(local_40,"\x1b[31mERROR\x1b[0m: ");
  append_str(local_40,(char *)args[0].reg_save_area);
  file_00 = _stderr;
  pcVar2 = to_string(local_40);
  log_log(7,file_00,pcVar2,(__va_list_tag *)&buff);
  recycle_buff(local_40);
  exit(1);
}

Assistant:

void log_code(char *file, int row, int col, const char *message, ...) {
    va_list args;
    va_start(args,message);
    CharBuff *buff = new_buff(100);
    append_str(buff, file);
    append_str(buff, ":");
    append_str(buff, itochr(row));
    append_chr(buff, ':');
    append_str(buff, itochr(col));
    append_chr(buff, ':');
    append_str(buff, TAG_ERROR);
    append_str(buff, message);
    log_log(LOG_LEVEL_ERROR, stderr, to_string(buff), args);
    va_end(args);
    recycle_buff(buff);
    exit(1);
}